

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

void __thiscall cppurses::Terminal::ncurses_set_palette(Terminal *this,Palette *colors)

{
  Color CVar1;
  bool bVar2;
  short sVar3;
  Underlying_color_t UVar4;
  Underlying_color_t UVar5;
  Underlying_color_t UVar6;
  const_iterator pvVar7;
  Underlying_color_t ncurses_color_number;
  int max_color;
  Color_definition *def;
  const_iterator __end2;
  const_iterator __begin2;
  Palette *__range2;
  Palette *colors_local;
  Terminal *this_local;
  
  bVar2 = can_change_colors(this);
  if (bVar2) {
    __end2 = std::array<cppurses::Color_definition,_16UL>::begin(colors);
    pvVar7 = std::array<cppurses::Color_definition,_16UL>::end(colors);
    for (; __end2 != pvVar7; __end2 = __end2 + 1) {
      bVar2 = has_extended_colors(this);
      sVar3 = 8;
      if (bVar2) {
        sVar3 = 0x10;
      }
      CVar1 = __end2->color;
      if ((short)CVar1 < sVar3) {
        UVar4 = anon_unknown.dwarf_1229d5::scale((__end2->values).red);
        UVar5 = anon_unknown.dwarf_1229d5::scale((__end2->values).green);
        UVar6 = anon_unknown.dwarf_1229d5::scale((__end2->values).blue);
        init_color((int)(short)CVar1,(int)UVar4,(int)UVar5,(int)UVar6);
      }
    }
  }
  return;
}

Assistant:

void Terminal::ncurses_set_palette(const Palette& colors)
{
    if (this->can_change_colors()) {
        for (const Color_definition& def : colors) {
            const auto max_color = this->has_extended_colors() ? 16 : 8;
            const auto ncurses_color_number =
                static_cast<Underlying_color_t>(def.color);
            if (ncurses_color_number < max_color) {
                ::init_color(ncurses_color_number, scale(def.values.red),
                             scale(def.values.green), scale(def.values.blue));
            }
        }
    }
}